

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O2

DynamicObject * __thiscall
JsrtDebuggerObjectBase::GetChildren
          (JsrtDebuggerObjectBase *this,
          WeakArenaReference<Js::IDiagObjectModelWalkerBase> *walkerRef,ScriptContext *scriptContext
          ,uint fromCount,uint totalCount)

{
  uint32 nValue;
  uint value;
  int iVar1;
  DynamicObject *object;
  JavascriptArray *value_00;
  JavascriptArray *value_01;
  IDiagObjectModelWalkerBase *pIVar2;
  WeakArenaReference<Js::IDiagObjectModelDisplay> *pWVar3;
  IDiagObjectModelDisplay *pIVar4;
  JsrtDebuggerObjectBase *pJVar5;
  undefined4 extraout_var;
  Var value_02;
  Var pvVar6;
  uint32 uVar7;
  uint32 nValue_00;
  undefined1 local_d0 [8];
  ResolvedObject resolvedObject;
  BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_> local_50;
  AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
  objectDisplayWeakRef;
  
  value = 0;
  object = Js::JavascriptLibrary::CreateObject
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
  value_00 = Js::JavascriptLibrary::CreateArray
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  value_01 = Js::JavascriptLibrary::CreateArray
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  pIVar2 = Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::GetStrongReference(walkerRef)
  ;
  if (pIVar2 != (IDiagObjectModelWalkerBase *)0x0) {
    resolvedObject._56_8_ = pIVar2;
    value = (*pIVar2->_vptr_IDiagObjectModelWalkerBase[1])(pIVar2);
    if (fromCount < value) {
      nValue_00 = 0;
      objectDisplayWeakRef.super_BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>.
      ptr = (BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>)
            __tls_get_addr(&PTR_013e5f18);
      nValue = 0;
      while ((fromCount < value && (nValue + nValue_00 < totalCount))) {
        local_d0._0_4_ = -1;
        resolvedObject.name._4_1_ = 0;
        resolvedObject.obj = (Var)0x0;
        resolvedObject.originalObj = (Var)0x0;
        resolvedObject.address = (IDiagObjectAddress *)0x0;
        resolvedObject.objectDisplay = (IDiagObjectModelDisplay *)0x0;
        resolvedObject.propId = 0;
        resolvedObject._4_4_ = 0;
        resolvedObject.scriptContext = (ScriptContext *)0x0;
        (*(code *)**(undefined8 **)resolvedObject._56_8_)
                  (resolvedObject._56_8_,fromCount,(ResolvedObject *)local_d0);
        local_50.ptr = Js::ResolvedObject::GetObjectDisplay((ResolvedObject *)local_d0);
        pWVar3 = BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::operator->
                           (&local_50);
        pIVar4 = Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::GetStrongReference(pWVar3)
        ;
        if (pIVar4 != (IDiagObjectModelDisplay *)0x0) {
          pJVar5 = JsrtDebuggerObjectProperty::Make(this->debuggerObjectsManager,local_50.ptr);
          iVar1 = (*pJVar5->_vptr_JsrtDebuggerObjectBase[2])(pJVar5,resolvedObject._0_8_,0);
          value_02 = Js::CrossSite::MarshalVar
                               (scriptContext,(Var)CONCAT44(extraout_var,iVar1),false);
          iVar1 = (*pIVar4->_vptr_IDiagObjectModelDisplay[0xc])(pIVar4);
          if ((char)iVar1 == '\0') {
            uVar7 = nValue + 1;
            pvVar6 = Js::JavascriptNumber::ToVar(nValue,scriptContext);
            Js::JavascriptOperators::OP_SetElementI
                      (value_00,pvVar6,value_02,scriptContext,PropertyOperation_None);
          }
          else {
            pvVar6 = Js::JavascriptNumber::ToVar(nValue_00,scriptContext);
            Js::JavascriptOperators::OP_SetElementI
                      (value_01,pvVar6,value_02,scriptContext,PropertyOperation_None);
            nValue_00 = nValue_00 + 1;
            uVar7 = nValue;
          }
          pWVar3 = BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::operator->
                             (&local_50);
          Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::ReleaseStrongReference(pWVar3);
          local_50.ptr = (WeakArenaReference<Js::IDiagObjectModelDisplay> *)0x0;
          nValue = uVar7;
        }
        AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>::
        ~AutoPtr((AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
                  *)&local_50);
        fromCount = fromCount + 1;
      }
    }
    Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::ReleaseStrongReference(walkerRef);
  }
  JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0x20,value,scriptContext);
  JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0x15,value_00,scriptContext);
  JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0x4,value_01,scriptContext);
  return object;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectBase::GetChildren(WeakArenaReference<Js::IDiagObjectModelWalkerBase>* walkerRef, Js::ScriptContext * scriptContext, uint fromCount, uint totalCount)
{
    Js::DynamicObject* childrensObject = scriptContext->GetLibrary()->CreateObject();

    uint propertiesArrayCount = 0;
    Js::JavascriptArray* propertiesArray = scriptContext->GetLibrary()->CreateArray();

    uint debuggerOnlyPropertiesArrayCount = 0;
    Js::JavascriptArray* debuggerOnlyPropertiesArray = scriptContext->GetLibrary()->CreateArray();

    Js::IDiagObjectModelWalkerBase* walker = walkerRef->GetStrongReference();

    uint32 childrensCount = 0;

    if (walker != nullptr)
    {
        try
        {
            childrensCount = walker->GetChildrenCount();
        }
        catch (const Js::JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
        }

        if (fromCount < childrensCount)
        {
            for (uint32 i = fromCount; i < childrensCount && (propertiesArrayCount + debuggerOnlyPropertiesArrayCount) < totalCount; ++i)
            {
                Js::ResolvedObject resolvedObject;

                try
                {
                    walker->Get(i, &resolvedObject);
                }
                catch (const Js::JavascriptException& err)
                {
                    Js::JavascriptExceptionObject* exception = err.GetAndClear();
                    Js::Var error = exception->GetThrownObject(scriptContext);
                    resolvedObject.obj = error;
                    resolvedObject.address = nullptr;
                    resolvedObject.scriptContext = exception->GetScriptContext();
                    resolvedObject.typeId = Js::JavascriptOperators::GetTypeId(error);
                    resolvedObject.name = _u("{error}");
                    resolvedObject.propId = Js::Constants::NoProperty;
                }

                AutoPtr<WeakArenaReference<Js::IDiagObjectModelDisplay>> objectDisplayWeakRef(resolvedObject.GetObjectDisplay());
                Js::IDiagObjectModelDisplay* resolvedObjectDisplay = objectDisplayWeakRef->GetStrongReference();
                if (resolvedObjectDisplay != nullptr)
                {
                    JsrtDebuggerObjectBase* debuggerObject = JsrtDebuggerObjectProperty::Make(this->GetDebuggerObjectsManager(), objectDisplayWeakRef);
                    try
                    {
                        Js::DynamicObject* object = debuggerObject->GetJSONObject(resolvedObject.scriptContext, /* forceSetValueProp */ false);
                        Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, object);
                        if (resolvedObjectDisplay->IsFake())
                        {
                            Js::JavascriptOperators::OP_SetElementI((Js::Var)debuggerOnlyPropertiesArray, Js::JavascriptNumber::ToVar(debuggerOnlyPropertiesArrayCount++, scriptContext), marshaledObj, scriptContext);
                        }
                        else
                        {
                            Js::JavascriptOperators::OP_SetElementI((Js::Var)propertiesArray, Js::JavascriptNumber::ToVar(propertiesArrayCount++, scriptContext), marshaledObj, scriptContext);
                        }
                    }
                    catch (const Js::JavascriptException& err)
                    {
                        err.GetAndClear();   // discard exception object
                    }
                    objectDisplayWeakRef->ReleaseStrongReference();
                    objectDisplayWeakRef.Detach();
                }
            }
        }

        walkerRef->ReleaseStrongReference();
    }

    JsrtDebugUtils::AddPropertyToObject(childrensObject, JsrtDebugPropertyId::totalPropertiesOfObject, childrensCount, scriptContext);
    JsrtDebugUtils::AddPropertyToObject(childrensObject, JsrtDebugPropertyId::properties, propertiesArray, scriptContext);
    JsrtDebugUtils::AddPropertyToObject(childrensObject, JsrtDebugPropertyId::debuggerOnlyProperties, debuggerOnlyPropertiesArray, scriptContext);

    return childrensObject;
}